

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error __thiscall asmjit::Logger::logv(Logger *this,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  Error EVar3;
  char buf [1024];
  char acStack_418 [1032];
  
  uVar2 = vsnprintf(acStack_418,0x400,fmt,ap);
  uVar1 = 0x3ff;
  if (uVar2 < 0x3ff) {
    uVar1 = uVar2;
  }
  EVar3 = (*this->_vptr_Logger[2])(this,acStack_418,(ulong)uVar1);
  return EVar3;
}

Assistant:

Error Logger::logv(const char* fmt, va_list ap) noexcept {
  char buf[1024];
  size_t len = vsnprintf(buf, sizeof(buf), fmt, ap);

  if (len >= sizeof(buf))
    len = sizeof(buf) - 1;
  return log(buf, len);
}